

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

void build_node(XML_Parser parser,int src_node,XML_Content *dest,XML_Content **contpos,
               XML_Char **strpos)

{
  char cVar1;
  int src_node_00;
  undefined4 uVar2;
  DTD *pDVar3;
  CONTENT_SCAFFOLD *pCVar4;
  undefined4 uVar7;
  char *pcVar5;
  XML_Content *pXVar6;
  char *pcVar8;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  long lStack_50;
  
  pDVar3 = parser->m_dtd;
  pCVar4 = pDVar3->scaffold;
  uVar2 = pCVar4[src_node].type;
  uVar7 = pCVar4[src_node].quant;
  dest->type = uVar2;
  dest->quant = uVar7;
  if (uVar2 == 4) {
    dest->name = *strpos;
    pcVar8 = pCVar4[src_node].name;
    do {
      cVar1 = *pcVar8;
      pcVar5 = *strpos;
      *strpos = pcVar5 + 1;
      *pcVar5 = cVar1;
      cVar1 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar1 != '\0');
    dest->numchildren = 0;
    lStack_50 = 0x18;
  }
  else {
    uVar9 = (ulong)(uint)pCVar4[src_node].childcnt;
    dest->numchildren = pCVar4[src_node].childcnt;
    pXVar6 = *contpos;
    dest->children = pXVar6;
    *contpos = pXVar6 + uVar9;
    piVar10 = &pDVar3->scaffold[src_node].firstchild;
    lVar12 = 0;
    for (uVar11 = 0; uVar11 < uVar9; uVar11 = uVar11 + 1) {
      src_node_00 = *piVar10;
      build_node(parser,src_node_00,(XML_Content *)((long)&dest->children->type + lVar12),contpos,
                 strpos);
      piVar10 = &pDVar3->scaffold[src_node_00].nextsib;
      uVar9 = (ulong)dest->numchildren;
      lVar12 = lVar12 + 0x20;
    }
    lStack_50 = 8;
  }
  *(undefined8 *)((long)&dest->type + lStack_50) = 0;
  return;
}

Assistant:

static void
build_node(XML_Parser parser,
           int src_node,
           XML_Content *dest,
           XML_Content **contpos,
           XML_Char **strpos)
{
  DTD * const dtd = _dtd;  /* save one level of indirection */
  dest->type = dtd->scaffold[src_node].type;
  dest->quant = dtd->scaffold[src_node].quant;
  if (dest->type == XML_CTYPE_NAME) {
    const XML_Char *src;
    dest->name = *strpos;
    src = dtd->scaffold[src_node].name;
    for (;;) {
      *(*strpos)++ = *src;
      if (!*src)
        break;
      src++;
    }
    dest->numchildren = 0;
    dest->children = NULL;
  }
  else {
    unsigned int i;
    int cn;
    dest->numchildren = dtd->scaffold[src_node].childcnt;
    dest->children = *contpos;
    *contpos += dest->numchildren;
    for (i = 0, cn = dtd->scaffold[src_node].firstchild;
         i < dest->numchildren;
         i++, cn = dtd->scaffold[cn].nextsib) {
      build_node(parser, cn, &(dest->children[i]), contpos, strpos);
    }
    dest->name = NULL;
  }
}